

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * luaG_addinfo(lua_State *L,char *msg,TString *src,int line)

{
  char *pcVar1;
  char local_68 [8];
  char buff [60];
  int line_local;
  TString *src_local;
  char *msg_local;
  lua_State *L_local;
  
  if (src == (TString *)0x0) {
    local_68[0] = '?';
    local_68[1] = 0;
  }
  else {
    luaO_chunkid(local_68,(char *)(src + 1),0x3c);
  }
  pcVar1 = luaO_pushfstring(L,"%s:%d: %s",local_68,(ulong)(uint)line,msg);
  return pcVar1;
}

Assistant:

const char *luaG_addinfo (lua_State *L, const char *msg, TString *src,
                                        int line) {
  char buff[LUA_IDSIZE];
  if (src)
    luaO_chunkid(buff, getstr(src), LUA_IDSIZE);
  else {  /* no source available; use "?" instead */
    buff[0] = '?'; buff[1] = '\0';
  }
  return luaO_pushfstring(L, "%s:%d: %s", buff, line, msg);
}